

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPCMacAlgorithm.cpp
# Opt level: O0

bool __thiscall OSSLEVPCMacAlgorithm::verifyFinal(OSSLEVPCMacAlgorithm *this,ByteString *signature)

{
  CMAC_CTX *ctx;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ByteString *compareTo;
  ByteString *in_RSI;
  MacAlgorithm *in_RDI;
  size_t outLen;
  ByteString macResult;
  size_t in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  ByteString *local_48 [8];
  bool local_1;
  ByteString *this_00;
  
  bVar1 = MacAlgorithm::verifyFinal(in_RDI,in_RSI);
  if (bVar1) {
    ByteString::ByteString((ByteString *)0x131860);
    iVar2 = (*in_RDI->_vptr_MacAlgorithm[0xb])();
    this_00 = (ByteString *)CONCAT44(extraout_var,iVar2);
    local_48[0] = this_00;
    ByteString::resize((ByteString *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       in_stack_ffffffffffffff78);
    ctx = (CMAC_CTX *)in_RDI[1]._vptr_MacAlgorithm;
    compareTo = (ByteString *)
                ByteString::operator[]
                          ((ByteString *)
                           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                           in_stack_ffffffffffffff78);
    iVar2 = CMAC_Final(ctx,(uchar *)compareTo,(size_t *)local_48);
    if (iVar2 == 0) {
      softHSMLog(3,"verifyFinal",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPCMacAlgorithm.cpp"
                 ,0xe8,"CMAC_Final failed");
      CMAC_CTX_free((CMAC_CTX *)in_RDI[1]._vptr_MacAlgorithm);
      in_RDI[1]._vptr_MacAlgorithm = (_func_int **)0x0;
      local_1 = false;
    }
    else {
      CMAC_CTX_free((CMAC_CTX *)in_RDI[1]._vptr_MacAlgorithm);
      in_RDI[1]._vptr_MacAlgorithm = (_func_int **)0x0;
      local_1 = ByteString::operator==(this_00,compareTo);
    }
    ByteString::~ByteString((ByteString *)0x131998);
  }
  else {
    local_1 = false;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool OSSLEVPCMacAlgorithm::verifyFinal(ByteString& signature)
{
	if (!MacAlgorithm::verifyFinal(signature))
	{
		return false;
	}

	ByteString macResult;
	size_t outLen = getMacSize();
	macResult.resize(outLen);

	if (!CMAC_Final(curCTX, &macResult[0], &outLen))
	{
		ERROR_MSG("CMAC_Final failed");

		CMAC_CTX_free(curCTX);
		curCTX = NULL;

		return false;
	}

	CMAC_CTX_free(curCTX);
	curCTX = NULL;

	return macResult == signature;
}